

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O3

void __thiscall
SStringViewRelational_Eq_Test<const_(anonymous_namespace)::sstringview_maker>::
~SStringViewRelational_Eq_Test
          (SStringViewRelational_Eq_Test<const_(anonymous_namespace)::sstringview_maker> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Eq) {
#define EQ(lhs, rhs, x)                                                                            \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ (lhs_view == (rhs), (x));                                                        \
        EXPECT_EQ ((rhs) == lhs_view, (x));                                                        \
    } while (0)
    EQ ("", TypeParam (""), true);
    EQ ("", TypeParam ("abcde"), false);
    EQ ("", TypeParam ("abcdefghij"), false);
    EQ ("", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcde", TypeParam (""), false);
    EQ ("abcde", TypeParam ("abcde"), true);
    EQ ("abcde", TypeParam ("abcdefghij"), false);
    EQ ("abcde", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcdefghij", TypeParam (""), false);
    EQ ("abcdefghij", TypeParam ("abcde"), false);
    EQ ("abcdefghij", TypeParam ("abcdefghij"), true);
    EQ ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam (""), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcde"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), false);
    EQ ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), true);
#undef EQ
}